

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O0

unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> __thiscall
spvtools::opt::InlinePass::NewLabel(InlinePass *this,uint32_t label_id)

{
  Instruction *this_00;
  IRContext *c;
  uint32_t in_EDX;
  undefined4 in_register_00000034;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_38;
  undefined1 local_1d;
  uint32_t local_1c;
  Pass *pPStack_18;
  uint32_t label_id_local;
  InlinePass *this_local;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> *newLabel
  ;
  
  local_1d = 0;
  local_1c = in_EDX;
  pPStack_18 = (Pass *)CONCAT44(in_register_00000034,label_id);
  this_local = this;
  this_00 = (Instruction *)operator_new(0x70);
  c = Pass::context((Pass *)CONCAT44(in_register_00000034,label_id));
  memset(&local_38,0,0x18);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector(&local_38);
  Instruction::Instruction(this_00,c,OpLabel,0,local_1c,&local_38);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)this,this_00);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_38);
  return (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Instruction> InlinePass::NewLabel(uint32_t label_id) {
  std::unique_ptr<Instruction> newLabel(
      new Instruction(context(), spv::Op::OpLabel, 0, label_id, {}));
  return newLabel;
}